

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_recursive_cte.cpp
# Opt level: O3

void duckdb::PopulateChunk
               (DataChunk *group_chunk,DataChunk *input_chunk,vector<unsigned_long,_true> *idx_set,
               bool reference)

{
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  reference this;
  reference other;
  unsigned_long __n;
  size_type __n_00;
  long lVar4;
  
  puVar1 = (idx_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (idx_set->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar2) {
    lVar4 = 0;
    __n_00 = 0;
    do {
      if (reference) {
        this = vector<duckdb::Vector,_true>::operator[](&group_chunk->data,__n_00);
        __n = puVar1[__n_00];
      }
      else {
        this = vector<duckdb::Vector,_true>::operator[](&group_chunk->data,puVar1[__n_00]);
        __n = __n_00;
      }
      other = vector<duckdb::Vector,_true>::operator[](&input_chunk->data,__n);
      Vector::Reference(this,other);
      __n_00 = __n_00 + 1;
      lVar3 = lVar4 + 8;
      lVar4 = lVar4 + 8;
    } while ((pointer)((long)puVar1 + lVar3) != puVar2);
  }
  group_chunk->count = input_chunk->count;
  return;
}

Assistant:

void PopulateChunk(DataChunk &group_chunk, DataChunk &input_chunk, const vector<idx_t> &idx_set, bool reference) {
	idx_t chunk_index = 0;
	// Populate the group_chunk
	for (auto &group_idx : idx_set) {
		if (reference) {
			// Reference from input_chunk[chunk_index] -> group_chunk[group_idx]
			group_chunk.data[chunk_index++].Reference(input_chunk.data[group_idx]);
		} else {
			// Reference from input_chunk[group.index] -> group_chunk[chunk_index]
			group_chunk.data[group_idx].Reference(input_chunk.data[chunk_index++]);
		}
	}
	group_chunk.SetCardinality(input_chunk.size());
}